

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

void __thiscall Arbitraryunsignedchar::~Arbitraryunsignedchar(Arbitraryunsignedchar *this)

{
  Arbitraryunsignedchar *this_local;
  
  ~Arbitraryunsignedchar(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(unsignedchar, Arbitrary)
{
  testinator::Arbitrary<unsigned char> a;
  unsigned char v = a.generate(0,0);
  a.shrink(v);
  return true;
}